

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O0

sljit_s32 emit_mov_byte(sljit_compiler *compiler,sljit_s32 sign,sljit_s32 dst,sljit_sw dstw,
                       sljit_s32 src,sljit_sw srcw)

{
  sljit_s32 sVar1;
  sljit_u8 sVar2;
  sljit_u8 *psVar3;
  sljit_s32 local_48;
  sljit_s32 local_44;
  sljit_s32 dst_r;
  sljit_u8 *inst;
  sljit_sw srcw_local;
  sljit_s32 src_local;
  sljit_sw dstw_local;
  sljit_s32 dst_local;
  sljit_s32 sign_local;
  sljit_compiler *compiler_local;
  
  compiler->mode32 = 0;
  if ((src & 0x40U) == 0) {
    local_48 = dst;
    if (0x3f < dst) {
      local_48 = 0xf;
    }
    local_44 = local_48;
    if (((dst & 0x80U) == 0) || (sVar1 = src, 0x3f < src)) {
      psVar3 = emit_x86_instruction(compiler,2,local_48,0,src,srcw);
      if (psVar3 == (sljit_u8 *)0x0) {
        return compiler->error;
      }
      *psVar3 = '\x0f';
      sVar2 = 0xb6;
      if (sign != 0) {
        sVar2 = 0xbe;
      }
      psVar3[1] = sVar2;
      sVar1 = local_44;
    }
    local_44 = sVar1;
    if ((dst & 0x80U) != 0) {
      psVar3 = emit_x86_instruction(compiler,0xc1,local_44,0,dst,dstw);
      if (psVar3 == (sljit_u8 *)0x0) {
        return compiler->error;
      }
      *psVar3 = 0x88;
    }
    compiler_local._4_4_ = 0;
  }
  else if (dst < 0x40) {
    psVar3 = emit_x86_instruction(compiler,1,0x40,srcw,dst,0);
    if (psVar3 == (sljit_u8 *)0x0) {
      compiler_local._4_4_ = compiler->error;
    }
    else {
      *psVar3 = 199;
      compiler_local._4_4_ = 0;
    }
  }
  else {
    psVar3 = emit_x86_instruction(compiler,0x181,0x40,srcw,dst,dstw);
    if (psVar3 == (sljit_u8 *)0x0) {
      compiler_local._4_4_ = compiler->error;
    }
    else {
      *psVar3 = 0xc6;
      compiler_local._4_4_ = 0;
    }
  }
  return compiler_local._4_4_;
}

Assistant:

static sljit_s32 emit_mov_byte(struct sljit_compiler *compiler, sljit_s32 sign,
	sljit_s32 dst, sljit_sw dstw,
	sljit_s32 src, sljit_sw srcw)
{
	sljit_u8* inst;
	sljit_s32 dst_r;
#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
	sljit_s32 work_r;
#endif

#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
	compiler->mode32 = 0;
#endif

	if (src & SLJIT_IMM) {
		if (FAST_IS_REG(dst)) {
#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
			return emit_do_imm(compiler, MOV_r_i32 + reg_map[dst], srcw);
#else
			inst = emit_x86_instruction(compiler, 1, SLJIT_IMM, srcw, dst, 0);
			FAIL_IF(!inst);
			*inst = MOV_rm_i32;
			return SLJIT_SUCCESS;
#endif
		}
		inst = emit_x86_instruction(compiler, 1 | EX86_BYTE_ARG | EX86_NO_REXW, SLJIT_IMM, srcw, dst, dstw);
		FAIL_IF(!inst);
		*inst = MOV_rm8_i8;
		return SLJIT_SUCCESS;
	}

	dst_r = FAST_IS_REG(dst) ? dst : TMP_REG1;

	if ((dst & SLJIT_MEM) && FAST_IS_REG(src)) {
#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
		if (reg_map[src] >= 4) {
			SLJIT_ASSERT(dst_r == TMP_REG1);
			EMIT_MOV(compiler, TMP_REG1, 0, src, 0);
		} else
			dst_r = src;
#else
		dst_r = src;
#endif
	}
#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
	else if (FAST_IS_REG(src) && reg_map[src] >= 4) {
		/* src, dst are registers. */
		SLJIT_ASSERT(SLOW_IS_REG(dst));
		if (reg_map[dst] < 4) {
			if (dst != src)
				EMIT_MOV(compiler, dst, 0, src, 0);
			inst = emit_x86_instruction(compiler, 2, dst, 0, dst, 0);
			FAIL_IF(!inst);
			*inst++ = GROUP_0F;
			*inst = sign ? MOVSX_r_rm8 : MOVZX_r_rm8;
		}
		else {
			if (dst != src)
				EMIT_MOV(compiler, dst, 0, src, 0);
			if (sign) {
				/* shl reg, 24 */
				inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_IMM, 24, dst, 0);
				FAIL_IF(!inst);
				*inst |= SHL;
				/* sar reg, 24 */
				inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_IMM, 24, dst, 0);
				FAIL_IF(!inst);
				*inst |= SAR;
			}
			else {
				inst = emit_x86_instruction(compiler, 1 | EX86_BIN_INS, SLJIT_IMM, 0xff, dst, 0);
				FAIL_IF(!inst);
				*(inst + 1) |= AND;
			}
		}
		return SLJIT_SUCCESS;
	}
#endif
	else {
		/* src can be memory addr or reg_map[src] < 4 on x86_32 architectures. */
		inst = emit_x86_instruction(compiler, 2, dst_r, 0, src, srcw);
		FAIL_IF(!inst);
		*inst++ = GROUP_0F;
		*inst = sign ? MOVSX_r_rm8 : MOVZX_r_rm8;
	}